

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer *
Serialize<FStrifeDialogueNode>
          (FSerializer *arc,char *key,FStrifeDialogueNode **node,FStrifeDialogueNode **def)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Value *this;
  FStrifeDialogueNode **ppFVar4;
  bool local_31;
  Value *val;
  FStrifeDialogueNode **def_local;
  FStrifeDialogueNode **node_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    bVar1 = FWriter::inObject(arc->w);
    if (((!bVar1) || (def == (FStrifeDialogueNode **)0x0)) || (*node != *def)) {
      FSerializer::WriteKey(arc,key);
      if (*node == (FStrifeDialogueNode *)0x0) {
        FWriter::Null(arc->w);
      }
      else {
        FWriter::Uint(arc->w,(*node)->ThisNodeNum);
      }
    }
  }
  else {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsUint(this);
      local_31 = true;
      if (!bVar1) {
        local_31 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::IsNull(this);
      }
      if (local_31 == false) {
        __assert_fail("val->IsUint() || val->IsNull()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x7dc,
                      "FSerializer &Serialize(FSerializer &, const char *, FStrifeDialogueNode *&, FStrifeDialogueNode **)"
                     );
      }
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsNull(this);
      if (bVar1) {
        *node = (FStrifeDialogueNode *)0x0;
      }
      else {
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::IsUint(this);
        if (bVar1) {
          uVar2 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::GetUint(this);
          uVar3 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Size(&StrifeDialogues);
          if (uVar2 < uVar3) {
            uVar2 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetUint(this);
            ppFVar4 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::operator[]
                                (&StrifeDialogues,(ulong)uVar2);
            *node = *ppFVar4;
          }
          else {
            *node = (FStrifeDialogueNode *)0x0;
          }
        }
        else {
          Printf("\x1cGinteger expected for \'%s\'",key);
          arc->mErrors = arc->mErrors + 1;
          *node = (FStrifeDialogueNode *)0x0;
        }
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FStrifeDialogueNode *&node, FStrifeDialogueNode **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || node != *def)
		{
			arc.WriteKey(key);
			if (node == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->Uint(node->ThisNodeNum);
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsUint() || val->IsNull());
			if (val->IsNull())
			{
				node = nullptr;
			}
			else if (val->IsUint())
			{
				if (val->GetUint() >= StrifeDialogues.Size())
				{
					node = nullptr;
				}
				else
				{
					node = StrifeDialogues[val->GetUint()];
				}
			}
			else
			{
				Printf(TEXTCOLOR_RED "integer expected for '%s'", key);
				arc.mErrors++;
				node = nullptr;
			}
		}
	}
	return arc;

}